

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O3

void duckdb::RecursiveGlobDirectories
               (FileSystem *fs,string *path,vector<duckdb::OpenFileInfo,_true> *result,
               bool match_directory,bool join_path)

{
  undefined1 local_52;
  undefined1 local_51;
  long *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  
  local_48 = 0;
  local_52 = join_path;
  local_51 = match_directory;
  local_50 = (long *)operator_new(0x28);
  *local_50 = (long)&local_52;
  local_50[1] = (long)fs;
  local_50[2] = (long)path;
  local_50[3] = (long)&local_51;
  local_50[4] = (long)result;
  local_38 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/local_file_system.cpp:1251:21)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/local_file_system.cpp:1251:21)>
             ::_M_manager;
  (*fs->_vptr_FileSystem[0x10])(fs,path,&local_50,0);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,3);
  }
  return;
}

Assistant:

static void RecursiveGlobDirectories(FileSystem &fs, const string &path, vector<OpenFileInfo> &result,
                                     bool match_directory, bool join_path) {

	fs.ListFiles(path, [&](const string &fname, bool is_directory) {
		string concat;
		if (join_path) {
			concat = fs.JoinPath(path, fname);
		} else {
			concat = fname;
		}
		if (IsSymbolicLink(concat)) {
			return;
		}
		if (is_directory == match_directory) {
			result.push_back(concat);
		}
		if (is_directory) {
			RecursiveGlobDirectories(fs, concat, result, match_directory, true);
		}
	});
}